

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::lts_20250127::debugging_internal::anon_unknown_0::Deallocate(void *p,size_t size)

{
  size_t size_local;
  void *p_local;
  
  munmap(p,size);
  return;
}

Assistant:

void Deallocate(void* p, size_t size) {
#ifdef ABSL_HAVE_MMAP
  ::munmap(p, size);
#else
  (void)p;
  (void)size;
#endif  // ABSL_HAVE_MMAP
}